

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O3

void gam_LocationF(int proc,Integer g_handle,Integer *subscript,char **ptr_loc,Integer *ld)

{
  short sVar1;
  int iVar2;
  C_Integer *pCVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int _ndim;
  ulong uVar8;
  global_array_t *pgVar9;
  global_array_t *pgVar10;
  C_Integer CVar11;
  long lVar12;
  long lVar13;
  Integer _lo [7];
  Integer _hi [7];
  int _index [7];
  long local_1b8 [8];
  long local_178 [8];
  int local_138 [66];
  
  pgVar9 = GA;
  pgVar10 = GA + g_handle;
  sVar1 = GA[g_handle].ndim;
  uVar8 = (ulong)sVar1;
  iVar5 = GA[g_handle].distr_type;
  if (iVar5 - 1U < 3) {
    lVar7 = pgVar10->num_blocks[0];
    lVar6 = (long)proc % lVar7;
    local_138[0] = (int)lVar6;
    if (1 < sVar1) {
      lVar13 = 0;
      uVar4 = (ulong)(uint)proc;
      do {
        uVar4 = (long)((int)uVar4 - (int)lVar6) / lVar7;
        lVar7 = GA[g_handle].num_blocks[lVar13 + 1];
        lVar6 = (long)(int)uVar4 % lVar7;
        local_138[lVar13 + 1] = (int)lVar6;
        lVar13 = lVar13 + 1;
      } while ((uVar8 & 0xffffffff) - 1 != lVar13);
    }
    if (0 < sVar1) {
      uVar4 = 0;
      do {
        iVar5 = local_138[uVar4];
        lVar7 = GA[g_handle].block_dims[uVar4];
        local_1b8[uVar4] = lVar7 * iVar5 + 1;
        lVar7 = ((long)iVar5 + 1) * lVar7;
        if (GA[g_handle].dims[uVar4] <= lVar7) {
          lVar7 = GA[g_handle].dims[uVar4];
        }
        local_178[uVar4] = lVar7;
        uVar4 = uVar4 + 1;
      } while ((uVar8 & 0xffffffff) != uVar4);
    }
LAB_0012691d:
    if (sVar1 < 1) goto LAB_001269b0;
  }
  else {
    if (iVar5 == 4) {
      lVar7 = pgVar10->num_blocks[0];
      lVar6 = (long)proc % lVar7;
      local_138[0] = (int)lVar6;
      if (1 < sVar1) {
        lVar13 = 0;
        uVar4 = (ulong)(uint)proc;
        do {
          uVar4 = (long)((int)uVar4 - (int)lVar6) / lVar7;
          lVar7 = GA[g_handle].num_blocks[lVar13 + 1];
          lVar6 = (long)(int)uVar4 % lVar7;
          local_138[lVar13 + 1] = (int)lVar6;
          lVar13 = lVar13 + 1;
        } while ((uVar8 & 0xffffffff) - 1 != lVar13);
      }
      if (0 < sVar1) {
        pCVar3 = GA[g_handle].mapc;
        uVar4 = 0;
        iVar5 = 0;
        do {
          iVar2 = local_138[uVar4];
          lVar6 = (long)iVar5 + (long)iVar2;
          local_1b8[uVar4] = pCVar3[lVar6];
          lVar7 = pgVar10->num_blocks[uVar4];
          if ((long)iVar2 < lVar7 + -1) {
            CVar11 = pCVar3[lVar6 + 1] + -1;
          }
          else {
            CVar11 = pgVar10->dims[uVar4];
          }
          local_178[uVar4] = CVar11;
          iVar5 = iVar5 + (int)lVar7;
          uVar4 = uVar4 + 1;
        } while ((uVar8 & 0xffffffff) != uVar4);
      }
      goto LAB_0012691d;
    }
    if (iVar5 != 0) goto LAB_0012691d;
    if (pgVar10->num_rstrctd == 0) {
      if (sVar1 < 1) goto LAB_001269b0;
      lVar7 = 1;
      uVar4 = 0;
      do {
        lVar7 = lVar7 * GA[g_handle].nblock[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar8 != uVar4);
      if ((-1 < proc) && (lVar6 = (long)proc, lVar7 - lVar6 != 0 && lVar6 <= lVar7)) {
        if (sVar1 < 1) goto LAB_001269b0;
        pCVar3 = pgVar10->mapc;
        uVar4 = 0;
        lVar7 = 0;
        do {
          lVar12 = (long)pgVar10->nblock[uVar4];
          lVar13 = lVar6 % lVar12;
          local_1b8[uVar4] = pCVar3[lVar13 + lVar7];
          if (lVar13 == lVar12 + -1) {
            CVar11 = pgVar10->dims[uVar4];
          }
          else {
            CVar11 = pCVar3[lVar13 + lVar7 + 1] + -1;
          }
          lVar7 = lVar7 + lVar12;
          local_178[uVar4] = CVar11;
          uVar4 = uVar4 + 1;
          lVar6 = lVar6 / lVar12;
        } while (uVar8 != uVar4);
        goto LAB_0012691d;
      }
    }
    else {
      lVar7 = (long)proc;
      if (lVar7 < pgVar10->num_rstrctd) {
        if (sVar1 < 1) goto LAB_001269b0;
        lVar6 = 1;
        uVar4 = 0;
        do {
          lVar6 = lVar6 * GA[g_handle].nblock[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar8 != uVar4);
        if ((-1 < proc) && (lVar6 - lVar7 != 0 && lVar7 <= lVar6)) {
          if (sVar1 < 1) goto LAB_001269b0;
          pCVar3 = pgVar10->mapc;
          lVar6 = 0;
          uVar4 = 0;
          do {
            lVar12 = (long)pgVar10->nblock[uVar4];
            lVar13 = lVar7 % lVar12;
            local_1b8[uVar4] = pCVar3[lVar13 + lVar6];
            if (lVar13 == lVar12 + -1) {
              CVar11 = pgVar10->dims[uVar4];
            }
            else {
              CVar11 = pCVar3[lVar13 + lVar6 + 1] + -1;
            }
            lVar6 = lVar6 + lVar12;
            local_178[uVar4] = CVar11;
            uVar4 = uVar4 + 1;
            lVar7 = lVar7 / lVar12;
          } while (uVar8 != uVar4);
          goto LAB_0012691d;
        }
      }
    }
    if (sVar1 < 1) goto LAB_001269b0;
    memset(local_1b8,0,uVar8 * 8);
    memset(local_178,0xff,uVar8 * 8);
  }
  lVar7 = 0;
  do {
    if (local_178[lVar7] < subscript[lVar7] || subscript[lVar7] < local_1b8[lVar7]) {
      sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
      pnga_error((char *)local_138,lVar7);
      pgVar9 = GA;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 < pgVar9[g_handle].ndim);
  pgVar10 = pgVar9 + g_handle;
LAB_001269b0:
  if (uVar8 == 1) {
    *ld = (local_178[0] - local_1b8[0]) + pgVar10->width[0] * 2 + 1;
  }
  if (sVar1 < 2) {
    lVar7 = 1;
    lVar6 = 0;
  }
  else {
    lVar7 = 1;
    lVar6 = 0;
    lVar13 = 0;
    do {
      lVar6 = lVar6 + ((pgVar9[g_handle].width[lVar13] + subscript[lVar13]) - local_1b8[lVar13]) *
                      lVar7;
      lVar12 = ((pgVar9[g_handle].width[lVar13] * 2 + 1) - local_1b8[lVar13]) + local_178[lVar13];
      ld[lVar13] = lVar12;
      lVar7 = lVar7 * lVar12;
      lVar13 = lVar13 + 1;
    } while (uVar8 - 1 != lVar13);
  }
  if (pgVar10->p_handle == 0) {
    CVar11 = (C_Integer)PGRP_LIST->inv_map_proc_list[proc];
  }
  else if (pgVar10->num_rstrctd == 0) {
    CVar11 = (C_Integer)proc;
  }
  else {
    CVar11 = pgVar10->rstrctd_list[proc];
  }
  *ptr_loc = pgVar10->ptr[CVar11] +
             (long)pgVar10->elemsize *
             (((subscript[uVar8 - 1] - local_1b8[uVar8 - 1]) + pgVar10->width[uVar8 - 1]) * lVar7 +
             lVar6);
  return;
}

Assistant:

void gam_LocationF(int proc, Integer g_handle,  Integer subscript[],
    char **ptr_loc, Integer ld[])
{                                                                          
  Integer _offset=0, _d, _w, _factor=1, _last=GA[g_handle].ndim-1;         
  Integer _lo[MAXDIM], _hi[MAXDIM], _pinv, _p_handle;                     
                                                                           
  ga_ownsM(g_handle, proc, _lo, _hi);                                      
  gaCheckSubscriptM(subscript, _lo, _hi, GA[g_handle].ndim);               
  if(_last==0) ld[0]=_hi[0]- _lo[0]+1+2*(Integer)GA[g_handle].width[0];   
  for(_d=0; _d < _last; _d++)            {                                 
    _w = (Integer)GA[g_handle].width[_d];                                  
    _offset += (subscript[_d]-_lo[_d]+_w) * _factor;                       
    ld[_d] = _hi[_d] - _lo[_d] + 1 + 2*_w;                                 
    _factor *= ld[_d];                                                     
  }                                                                        
  _offset += (subscript[_last]-_lo[_last]                                  
      + (Integer)GA[g_handle].width[_last])                                
  * _factor;                                                               
  _p_handle = GA[g_handle].p_handle;                                       
  if (_p_handle != 0) {                                                    
    if (GA[g_handle].num_rstrctd == 0) {                                   
      _pinv = proc;                                                        
    } else {                                                               
      _pinv = GA[g_handle].rstrctd_list[proc];                             
    }                                                                      
  } else {                                                                 
    _pinv = PGRP_LIST[_p_handle].inv_map_proc_list[proc];                  
  }                                                                       
  *(ptr_loc) =  GA[g_handle].ptr[_pinv]+_offset*GA[g_handle].elemsize;    
}